

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void key(GLFWwindow *window,int k,int scancode,int action,int mods)

{
  Tetromino *pTVar1;
  string *psVar2;
  ostream *poVar3;
  PlayMode mode;
  char cStack_10;
  
  if (1 < action - 1U) {
    return;
  }
  switch(k) {
  case 0x31:
    cStack_10 = 'I';
    break;
  case 0x32:
    cStack_10 = 'O';
    break;
  case 0x33:
    cStack_10 = 'T';
    break;
  case 0x34:
    cStack_10 = 'J';
    break;
  case 0x35:
    cStack_10 = 'L';
    break;
  case 0x36:
    cStack_10 = 'S';
    break;
  case 0x37:
    cStack_10 = 'Z';
    break;
  case 0x38:
    cStack_10 = 'D';
    break;
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x54:
  case 0x55:
  case 0x56:
    return;
  case 0x3d:
    World::increaseSpeed(world);
    return;
  case 0x41:
    World::rotateLeft(world);
    return;
  case 0x45:
    mode = INFINITY_MODE;
    goto LAB_00112541;
  case 0x50:
    pTVar1 = World::getActiveTet(world);
    psVar2 = (string *)(**(code **)(*(long *)&pTVar1->super_Entity + 0x40))(pTVar1);
    poVar3 = std::operator<<((ostream *)&std::cout,psVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  case 0x51:
    mode = REGULAR_MODE;
    goto LAB_00112541;
  case 0x52:
    World::resetTet(world,(TetrominoType *)0x0);
    return;
  case 0x53:
    World::rotateRight(world);
    return;
  case 0x57:
    mode = FROZEN_MODE;
LAB_00112541:
    World::setMode(world,mode);
    World::start(world);
    return;
  default:
    switch(k) {
    case 0x106:
      World::moveRight(world);
      return;
    case 0x107:
      World::moveLeft(world);
      return;
    case 0x108:
      World::moveDown(world);
      return;
    case 0x109:
      World::moveUp(world);
      return;
    }
    if (k != 0x20) {
      if (k != 0x2d) {
        return;
      }
      World::decreaseSpeed(world);
      return;
    }
    if (state != PLAYING) {
      state = PLAYING;
      return;
    }
    state = PAUSED;
    return;
  }
  World::resetTet(world,cStack_10);
  return;
}

Assistant:

void key(GLFWwindow* window, int k, int scancode, int action, int mods) {
    if (action == GLFW_PRESS || action == GLFW_REPEAT) {
        switch (k) {
            case GLFW_KEY_1:
                world->resetTet('I');
                break;
            case GLFW_KEY_2:
                world->resetTet('O');
                break;
            case GLFW_KEY_3:
                world->resetTet('T');
                break;
            case GLFW_KEY_4:
                world->resetTet('J');
                break;
            case GLFW_KEY_5:
                world->resetTet('L');
                break;
            case GLFW_KEY_6:
                world->resetTet('S');
                break;
            case GLFW_KEY_7:
                world->resetTet('Z');
                break;
            case GLFW_KEY_8:
                world->resetTet('D');
                break;
            case GLFW_KEY_Q:
                world->setMode(World::PlayMode::REGULAR_MODE);
                world->start();
                break;
            case GLFW_KEY_W:
                world->setMode(World::PlayMode::FROZEN_MODE);
                world->start();
                break;
            case GLFW_KEY_E:
                world->setMode(World::PlayMode::INFINITY_MODE);
                world->start();
                break;
            case GLFW_KEY_P:
                cout << *world->getActiveTet()->toString() << endl;
                break;
            case GLFW_KEY_A:
                world->rotateLeft();
                break;
            case GLFW_KEY_S:
                world->rotateRight();
                break;
            case GLFW_KEY_R:
                world->resetTet(nullptr);
                break;
            case GLFW_KEY_LEFT:
                world->moveLeft();
                break;
            case GLFW_KEY_RIGHT:
                world->moveRight();
                break;
            case GLFW_KEY_UP:
                world->moveUp();
                break;
            case GLFW_KEY_DOWN:
                world->moveDown();
                break;
            case GLFW_KEY_SPACE:
                if (state == MENU) {
                    state = PLAYING;
                } else if (state == PLAYING) {
                    state = PAUSED;
                } else if (state == PAUSED) {
                    state = PLAYING;
                }
                break;
            case GLFW_KEY_EQUAL:
                world->increaseSpeed();
                break;
            case GLFW_KEY_MINUS:
                world->decreaseSpeed();
                break;
            case GLFW_KEY_ESCAPE:
                break;
            default:
                return;
        }
    }
}